

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::synchronization_internal::anon_unknown_0::NodeSet::Init(NodeSet *this)

{
  int local_c;
  
  Vec<int>::clear(&this->table_);
  Vec<int>::resize(&this->table_,8);
  local_c = -1;
  Vec<int>::fill(&this->table_,&local_c);
  this->occupied_ = 0;
  return;
}

Assistant:

void Init() {
    table_.clear();
    table_.resize(kInline);
    table_.fill(kEmpty);
    occupied_ = 0;
  }